

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha256.c
# Opt level: O3

void sha256(void *data,int size,BYTE *hash)

{
  uint uVar1;
  byte bVar2;
  ulong uVar3;
  SHA256_CTX *pSVar4;
  long lVar5;
  bool bVar6;
  SHA256_CTX local_a8;
  
  pSVar4 = &local_a8;
  local_a8.datalen = 0;
  local_a8.bitlen = 0;
  local_a8.state[0] = 0x6a09e667;
  local_a8.state[1] = -0x4498517b;
  local_a8.state[2] = 0x3c6ef372;
  local_a8.state[3] = -0x5ab00ac6;
  local_a8.state[4] = 0x510e527f;
  local_a8.state[5] = -0x64fa9774;
  local_a8.state[6] = 0x1f83d9ab;
  local_a8.state[7] = 0x5be0cd19;
  if (size == 0) {
    local_a8.data[0] = 0x80;
    uVar1 = 0;
  }
  else {
    lVar5 = 0;
    do {
      local_a8.data[local_a8.datalen] = *(BYTE *)((long)data + lVar5);
      local_a8.datalen = local_a8.datalen + 1;
      if (local_a8.datalen == 0x40) {
        sha256_transform(&local_a8,local_a8.data);
        local_a8.bitlen = local_a8.bitlen + 0x200;
        local_a8.datalen = 0;
      }
      uVar1 = local_a8.datalen;
      lVar5 = lVar5 + 1;
    } while (size != lVar5);
    bVar6 = local_a8.datalen == 0x37;
    if (0x37 < local_a8.datalen) {
      uVar3 = (ulong)(uint)local_a8.datalen;
      local_a8.data[uVar3] = 0x80;
      if (uVar1 < 0x3f) {
        memset(local_a8.data + uVar3 + 1,0,(ulong)(0x3f - uVar1));
      }
      sha256_transform(&local_a8,local_a8.data);
      local_a8.data[0x20] = '\0';
      local_a8.data[0x21] = '\0';
      local_a8.data[0x22] = '\0';
      local_a8.data[0x23] = '\0';
      local_a8.data[0x24] = '\0';
      local_a8.data[0x25] = '\0';
      local_a8.data[0x26] = '\0';
      local_a8.data[0x27] = '\0';
      local_a8.data[0x28] = '\0';
      local_a8.data[0x29] = '\0';
      local_a8.data[0x2a] = '\0';
      local_a8.data[0x2b] = '\0';
      local_a8.data[0x2c] = '\0';
      local_a8.data[0x2d] = '\0';
      local_a8.data[0x2e] = '\0';
      local_a8.data[0x2f] = '\0';
      local_a8.data[0x10] = '\0';
      local_a8.data[0x11] = '\0';
      local_a8.data[0x12] = '\0';
      local_a8.data[0x13] = '\0';
      local_a8.data[0x14] = '\0';
      local_a8.data[0x15] = '\0';
      local_a8.data[0x16] = '\0';
      local_a8.data[0x17] = '\0';
      local_a8.data[0x18] = '\0';
      local_a8.data[0x19] = '\0';
      local_a8.data[0x1a] = '\0';
      local_a8.data[0x1b] = '\0';
      local_a8.data[0x1c] = '\0';
      local_a8.data[0x1d] = '\0';
      local_a8.data[0x1e] = '\0';
      local_a8.data[0x1f] = '\0';
      local_a8.data[0] = '\0';
      local_a8.data[1] = '\0';
      local_a8.data[2] = '\0';
      local_a8.data[3] = '\0';
      local_a8.data[4] = '\0';
      local_a8.data[5] = '\0';
      local_a8.data[6] = '\0';
      local_a8.data[7] = '\0';
      local_a8.data[8] = '\0';
      local_a8.data[9] = '\0';
      local_a8.data[10] = '\0';
      local_a8.data[0xb] = '\0';
      local_a8.data[0xc] = '\0';
      local_a8.data[0xd] = '\0';
      local_a8.data[0xe] = '\0';
      local_a8.data[0xf] = '\0';
      local_a8.data[0x30] = '\0';
      local_a8.data[0x31] = '\0';
      local_a8.data[0x32] = '\0';
      local_a8.data[0x33] = '\0';
      local_a8.data[0x34] = '\0';
      local_a8.data[0x35] = '\0';
      local_a8.data[0x36] = '\0';
      local_a8.data[0x37] = '\0';
      goto LAB_0016e337;
    }
    lVar5 = (long)local_a8.datalen;
    local_a8.data[lVar5] = 0x80;
    if (bVar6) goto LAB_0016e337;
    pSVar4 = (SHA256_CTX *)(local_a8.data + lVar5);
  }
  memset((BYTE *)((long)pSVar4 + 1),0,(ulong)(0x36 - uVar1) + 1);
LAB_0016e337:
  local_a8.bitlen = (long)local_a8.datalen * 8 + local_a8.bitlen;
  local_a8.data[0x3f] = (BYTE)local_a8.bitlen;
  local_a8.data[0x3e] = (BYTE)(local_a8.bitlen >> 8);
  local_a8.data[0x3d] = (BYTE)(local_a8.bitlen >> 0x10);
  local_a8.data[0x3c] = (BYTE)(local_a8.bitlen >> 0x18);
  local_a8.data[0x3b] = (BYTE)(local_a8.bitlen >> 0x20);
  local_a8.data[0x3a] = (BYTE)(local_a8.bitlen >> 0x28);
  local_a8.data[0x39] = (BYTE)(local_a8.bitlen >> 0x30);
  local_a8.data[0x38] = (BYTE)(local_a8.bitlen >> 0x38);
  sha256_transform(&local_a8,local_a8.data);
  lVar5 = -4;
  bVar2 = 0x18;
  do {
    hash[lVar5 + 4] = (BYTE)(local_a8.state[0] >> (bVar2 & 0x1f));
    hash[lVar5 + 8] = (BYTE)(local_a8.state[1] >> (bVar2 & 0x1f));
    hash[lVar5 + 0xc] = (BYTE)(local_a8.state[2] >> (bVar2 & 0x1f));
    hash[lVar5 + 0x10] = (BYTE)(local_a8.state[3] >> (bVar2 & 0x1f));
    hash[lVar5 + 0x14] = (BYTE)(local_a8.state[4] >> (bVar2 & 0x1f));
    hash[lVar5 + 0x18] = (BYTE)(local_a8.state[5] >> (bVar2 & 0x1f));
    hash[lVar5 + 0x1c] = (BYTE)(local_a8.state[6] >> (bVar2 & 0x1f));
    hash[lVar5 + 0x20] = (BYTE)(local_a8.state[7] >> (bVar2 & 0x1f));
    bVar2 = bVar2 - 8;
    lVar5 = lVar5 + 1;
  } while (lVar5 != 0);
  return;
}

Assistant:

void sha256(const void* data, int size, BYTE hash[32])
{
    SHA256_CTX context;

    sha256_init(&context);
    sha256_update(&context, (const BYTE*)data, size);
    sha256_final(&context, hash);
}